

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POMDPDiscrete.cpp
# Opt level: O2

void __thiscall
POMDPDiscrete::POMDPDiscrete(POMDPDiscrete *this,string *name,string *descr,string *pf)

{
  undefined1 *this_00;
  
  this_00 = &(this->super_DecPOMDPDiscrete).field_0x220;
  *(undefined ***)&(this->super_DecPOMDPDiscrete).field_0x220 = &PTR__POSGInterface_00614e40;
  DecPOMDPInterface::DecPOMDPInterface((DecPOMDPInterface *)this_00,&PTR_PTR_006136d8);
  *(undefined8 *)&(this->super_DecPOMDPDiscrete).field_0x228 = 0x615028;
  *(undefined8 *)&(this->super_DecPOMDPDiscrete).field_0x220 = 0x6151d8;
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface
            ((DecPOMDPDiscreteInterface *)this_00,&PTR_construction_vtable_232__006136b0);
  DecPOMDPDiscrete::DecPOMDPDiscrete
            (&this->super_DecPOMDPDiscrete,&PTR_construction_vtable_96__00613600,name,descr,pf);
  *(undefined8 *)
   &(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
    super_MultiAgentDecisionProcess = 0x612e28;
  *(undefined8 *)&(this->super_DecPOMDPDiscrete).field_0x220 = 0x613228;
  *(undefined8 *)&(this->super_DecPOMDPDiscrete).field_0x228 = 0x613480;
  *(undefined8 *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.field_0x200
       = 0x6130a0;
  MultiAgentDecisionProcess::SetNrAgents((MultiAgentDecisionProcess *)this,1);
  return;
}

Assistant:

POMDPDiscrete::POMDPDiscrete(const std::string &name,
                             const std::string &descr,
                             const std::string &pf) :
    DecPOMDPDiscrete(name,descr,pf)
{
    this->SetNrAgents(1);
}